

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkageUntangler.cc
# Opt level: O2

void __thiscall
LinkageUntangler::select_by_size(LinkageUntangler *this,uint64_t min_size,uint64_t max_size)

{
  long lVar1;
  ulong uVar2;
  long lVar3;
  int n;
  ulong __n;
  reference rVar4;
  
  lVar3 = 0x58;
  for (__n = 1; lVar1 = *(long *)(**(long **)this + 0x40),
      __n < (ulong)((*(long *)(**(long **)this + 0x48) - lVar1) / 0x38); __n = __n + 1) {
    if (*(char *)(lVar1 + lVar3) != '\x01') {
      uVar2 = *(ulong *)(lVar1 + -0x18 + lVar3);
      if ((min_size <= uVar2) && (max_size == 0 || uVar2 <= max_size)) {
        rVar4 = std::vector<bool,_std::allocator<bool>_>::operator[]
                          ((vector<bool,_std::allocator<bool>_> *)(this + 8),__n);
        *rVar4._M_p = *rVar4._M_p | rVar4._M_mask;
      }
    }
    lVar3 = lVar3 + 0x38;
  }
  return;
}

Assistant:

void LinkageUntangler::select_by_size( uint64_t min_size, uint64_t max_size) {
    {
        for (auto n=1;n<dg.sdg.nodes.size();++n) {
            if (dg.sdg.nodes[n].status==NodeStatus::Deleted) continue;
            if (dg.sdg.nodes[n].sequence.size() >= min_size and
                (max_size==0 or dg.sdg.nodes[n].sequence.size() <= max_size))
                selected_nodes[n]=true;
        }
    }
}